

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef.cpp
# Opt level: O0

void FinishActor(FScriptPosition *sc,PClassActor *info,Baggage *bag)

{
  Baggage *pBVar1;
  PClassActor *pPVar2;
  bool bVar3;
  char *pcVar4;
  FName local_7c;
  FState *local_78;
  FState *fire;
  FState *local_68;
  FState *deselect;
  FState *local_58;
  FState *select;
  FState *local_48;
  FState *ready;
  CRecoverableError *err;
  AActor *local_28;
  AActor *defaults;
  Baggage *bag_local;
  PClassActor *info_local;
  FScriptPosition *sc_local;
  
  local_28 = (AActor *)(info->super_PClass).Defaults;
  defaults = (AActor *)bag;
  bag_local = (Baggage *)info;
  info_local = (PClassActor *)sc;
  FStateDefinitions::FinishStates(&bag->statedef,info,local_28);
  FStateDefinitions::InstallStates
            ((FStateDefinitions *)&(defaults->super_DThinker).super_DObject.ObjectFlags,
             (PClassActor *)bag_local,local_28);
  FStateDefinitions::MakeStateDefines
            ((FStateDefinitions *)&(defaults->super_DThinker).super_DObject.ObjectFlags,
             (PClassActor *)0x0);
  if (((ulong)(defaults->super_DThinker).super_DObject.ObjNext & 1) != 0) {
    bag_local[3].statedef.laststatebeforelabel = (FState *)(defaults->__Pos).Z;
    GC::WriteBarrier((DObject *)bag_local,(DObject *)bag_local[3].statedef.laststatebeforelabel);
  }
  bVar3 = PClass::IsDescendantOf((PClass *)bag_local,AInventory::RegistrationInfo.MyClass);
  if (bVar3) {
    TFlags<ActorFlag,_unsigned_int>::operator|=(&local_28->flags,MF_SPECIAL);
  }
  bVar3 = PClass::IsDescendantOf((PClass *)bag_local,AWeapon::RegistrationInfo.MyClass);
  pBVar1 = bag_local;
  if (bVar3) {
    FName::FName((FName *)((long)&select + 4),NAME_Ready);
    local_48 = PClassActor::FindState((PClassActor *)pBVar1,(FName *)((long)&select + 4));
    pBVar1 = bag_local;
    FName::FName((FName *)((long)&deselect + 4),NAME_Select);
    local_58 = PClassActor::FindState((PClassActor *)pBVar1,(FName *)((long)&deselect + 4));
    pBVar1 = bag_local;
    FName::FName((FName *)((long)&fire + 4),NAME_Deselect);
    local_68 = PClassActor::FindState((PClassActor *)pBVar1,(FName *)((long)&fire + 4));
    pBVar1 = bag_local;
    FName::FName(&local_7c,NAME_Fire);
    local_78 = PClassActor::FindState((PClassActor *)pBVar1,&local_7c);
    pPVar2 = info_local;
    if ((((local_48 != (FState *)0x0) || (local_58 != (FState *)0x0)) || (local_68 != (FState *)0x0)
        ) || (local_78 != (FState *)0x0)) {
      if (local_48 == (FState *)0x0) {
        pcVar4 = FName::GetChars((FName *)&bag_local[1].Lumpnum);
        FScriptPosition::Message
                  ((FScriptPosition *)pPVar2,2,"Weapon %s doesn\'t define a ready state.\n",pcVar4);
      }
      pPVar2 = info_local;
      if (local_58 == (FState *)0x0) {
        pcVar4 = FName::GetChars((FName *)&bag_local[1].Lumpnum);
        FScriptPosition::Message
                  ((FScriptPosition *)pPVar2,2,"Weapon %s doesn\'t define a select state.\n",pcVar4)
        ;
      }
      pPVar2 = info_local;
      if (local_68 == (FState *)0x0) {
        pcVar4 = FName::GetChars((FName *)&bag_local[1].Lumpnum);
        FScriptPosition::Message
                  ((FScriptPosition *)pPVar2,2,"Weapon %s doesn\'t define a deselect state.\n",
                   pcVar4);
      }
      pPVar2 = info_local;
      if (local_78 == (FState *)0x0) {
        pcVar4 = FName::GetChars((FName *)&bag_local[1].Lumpnum);
        FScriptPosition::Message
                  ((FScriptPosition *)pPVar2,2,"Weapon %s doesn\'t define a fire state.\n",pcVar4);
      }
    }
  }
  return;
}

Assistant:

void FinishActor(const FScriptPosition &sc, PClassActor *info, Baggage &bag)
{
	AActor *defaults = (AActor*)info->Defaults;

	try
	{
		bag.statedef.FinishStates (info, defaults);
	}
	catch (CRecoverableError &err)
	{
		sc.Message(MSG_ERROR, "%s", err.GetMessage());
		bag.statedef.MakeStateDefines(NULL);
		return;
	}
	bag.statedef.InstallStates (info, defaults);
	bag.statedef.MakeStateDefines(NULL);
	if (bag.DropItemSet)
	{
		info->DropItems = bag.DropItemList;
		GC::WriteBarrier(info, info->DropItems);
	}
	if (info->IsDescendantOf (RUNTIME_CLASS(AInventory)))
	{
		defaults->flags |= MF_SPECIAL;
	}

	// Weapons must be checked for all relevant states. They may crash the game otherwise.
	if (info->IsDescendantOf(RUNTIME_CLASS(AWeapon)))
	{
		FState *ready = info->FindState(NAME_Ready);
		FState *select = info->FindState(NAME_Select);
		FState *deselect = info->FindState(NAME_Deselect);
		FState *fire = info->FindState(NAME_Fire);

		// Consider any weapon without any valid state abstract and don't output a warning
		// This is for creating base classes for weapon groups that only set up some properties.
		if (ready || select || deselect || fire)
		{
			if (!ready)
			{
				sc.Message(MSG_ERROR, "Weapon %s doesn't define a ready state.\n", info->TypeName.GetChars());
			}
			if (!select) 
			{
				sc.Message(MSG_ERROR, "Weapon %s doesn't define a select state.\n", info->TypeName.GetChars());
			}
			if (!deselect) 
			{
				sc.Message(MSG_ERROR, "Weapon %s doesn't define a deselect state.\n", info->TypeName.GetChars());
			}
			if (!fire) 
			{
				sc.Message(MSG_ERROR, "Weapon %s doesn't define a fire state.\n", info->TypeName.GetChars());
			}
		}
	}
}